

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIRType * __thiscall
spirv_cross::Compiler::get_variable_data_type(Compiler *this,SPIRVariable *var)

{
  uint32_t id;
  SPIRType *pSVar1;
  SPIRVariable *var_local;
  Compiler *this_local;
  
  id = get_variable_data_type_id(this,var);
  pSVar1 = get<spirv_cross::SPIRType>(this,id);
  return pSVar1;
}

Assistant:

SPIRType &Compiler::get_variable_data_type(const SPIRVariable &var)
{
	return get<SPIRType>(get_variable_data_type_id(var));
}